

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarView::mouseMoveEvent(QCalendarView *this,QMouseEvent *event)

{
  QAbstractItemModel *pQVar1;
  QCalendarModel *pQVar2;
  QDate date;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  int col;
  int row;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QAbstractItemView::model((QAbstractItemView *)this);
  pQVar2 = qobject_cast_helper<QtPrivate::QCalendarModel*,QObject>((QObject *)pQVar1);
  if (pQVar2 == (QCalendarModel *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QAbstractItemView::mouseMoveEvent((QAbstractItemView *)this,event);
      return;
    }
  }
  else {
    if (this->readOnly == false) {
      if (this->validDateClicked == true) {
        date = handleMouseEvent(this,event);
        if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
          row = -1;
          col = -1;
          pQVar2 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
          QCalendarModel::cellForDate(pQVar2,date,&row,&col);
          if ((row != -1) && (col != -1)) {
            pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
            pQVar1 = QAbstractItemView::model((QAbstractItemView *)this);
            (**(code **)(*(long *)pQVar1 + 0x60))(local_48,pQVar1,row,col);
            (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,local_48,0);
          }
        }
      }
      else {
        event[0xc] = (QMouseEvent)0x0;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::mouseMoveEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseMoveEvent(event);
        return;
    }

    if (readOnly)
        return;

    if (validDateClicked) {
       QDate date = handleMouseEvent(event);
        if (date.isValid()) {
            int row = -1, col = -1;
            static_cast<QCalendarModel *>(model())->cellForDate(date, &row, &col);
            if (row != -1 && col != -1) {
                selectionModel()->setCurrentIndex(model()->index(row, col), QItemSelectionModel::NoUpdate);
            }
        }
    } else {
        event->ignore();
    }
}